

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O3

void __thiscall
QVLABase<QRhiGles2::Scratch::SeparateSampler>::reallocate_impl
          (QVLABase<QRhiGles2::Scratch::SeparateSampler> *this,qsizetype prealloc,void *array,
          qsizetype asize,qsizetype aalloc)

{
  long lVar1;
  long lVar2;
  void *__src;
  ulong uVar3;
  void *__dest;
  size_t totalCapacity;
  ulong __size;
  
  lVar1 = (this->super_QVLABaseBase).a;
  lVar2 = (this->super_QVLABaseBase).s;
  if (lVar2 < asize) {
    asize = lVar2;
  }
  if (lVar1 == aalloc) {
    (this->super_QVLABaseBase).s = asize;
  }
  else {
    __src = (this->super_QVLABaseBase).ptr;
    __dest = array;
    if (prealloc < aalloc) {
      if ((ulong)aalloc >> 0x3c == 0) {
        uVar3 = QtPrivate::expectedAllocSize(aalloc << 4,0x10);
        prealloc = uVar3 >> 4;
        __size = uVar3 & 0xfffffffffffffff0;
        if (uVar3 == 0) {
          __size = aalloc << 4;
          prealloc = aalloc;
        }
        if (__size == 0) {
          __dest = (void *)0x0;
        }
        else {
          __dest = malloc(__size);
        }
      }
      else {
        __dest = (void *)0x0;
        prealloc = aalloc;
      }
    }
    if (asize != 0) {
      memcpy(__dest,__src,asize << 4);
    }
    (this->super_QVLABaseBase).ptr = __dest;
    (this->super_QVLABaseBase).a = prealloc;
    (this->super_QVLABaseBase).s = asize;
    if ((__src != array) && (__src != __dest)) {
      QtPrivate::sizedFree(__src,lVar1 << 4);
      return;
    }
  }
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QVLABase<T>::reallocate_impl(qsizetype prealloc, void *array, qsizetype asize, qsizetype aalloc)
{
    Q_ASSERT(aalloc >= asize);
    Q_ASSERT(data());
    T *oldPtr = data();
    qsizetype osize = size();
    const qsizetype oalloc = capacity();

    const qsizetype copySize = qMin(asize, osize);
    Q_ASSERT(copySize >= 0);

    if (aalloc != oalloc) {
        QVLABaseBase::malloced_ptr guard;
        void *newPtr;
        qsizetype newA;
        if (aalloc > prealloc) {
            newPtr = QtPrivate::fittedMalloc(0, &aalloc, sizeof(T));
            guard.reset(newPtr);
            Q_CHECK_PTR(newPtr); // could throw
            // by design: in case of QT_NO_EXCEPTIONS malloc must not fail or it crashes here
            newA = aalloc;
        } else {
            newPtr = array;
            newA = prealloc;
        }
        QtPrivate::q_uninitialized_relocate_n(oldPtr, copySize,
                                              reinterpret_cast<T *>(newPtr));
        // commit:
        ptr = newPtr;
        guard.release();
        a = newA;
    }
    s = copySize;

    // destroy remaining old objects
    if constexpr (QTypeInfo<T>::isComplex) {
        if (osize > asize)
            std::destroy(oldPtr + asize, oldPtr + osize);
    }

    if (oldPtr != reinterpret_cast<T *>(array) && oldPtr != data())
        QtPrivate::sizedFree(oldPtr, oalloc, sizeof(T));
}